

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O3

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingNeg_Test::TestBody
          (ScenePreprocessorTest_testMeshPreprocessingNeg_Test *this)

{
  bool bVar1;
  aiMesh *mesh;
  char *message;
  AssertionResult gtest_ar;
  Message local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  mesh = (aiMesh *)operator_new(0x520);
  mesh->mNumVertices = 0;
  mesh->mNumFaces = 0;
  memset(&mesh->mVertices,0,0xcc);
  mesh->mBones = (aiBone **)0x0;
  mesh->mMaterialIndex = 0;
  (mesh->mName).length = 0;
  (mesh->mName).data[0] = '\0';
  memset((mesh->mName).data + 1,0x1b,0x3ff);
  mesh->mNumAnimMeshes = 0;
  mesh->mAnimMeshes = (aiAnimMesh **)0x0;
  mesh->mMethod = 0;
  (mesh->mAABB).mMin.x = 0.0;
  (mesh->mAABB).mMin.y = 0.0;
  (mesh->mAABB).mMin.z = 0.0;
  (mesh->mAABB).mMax.x = 0.0;
  (mesh->mAABB).mMax.y = 0.0;
  (mesh->mAABB).mMax.z = 0.0;
  memset(mesh->mColors,0,0xa0);
  mesh->mPrimitiveTypes = 0xc;
  Assimp::ScenePreprocessor::ProcessMesh
            ((this->super_ScenePreprocessorTest).mScenePreprocessor,mesh);
  local_40.ss_.ptr_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_30,"static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON)",
             "p->mPrimitiveTypes",(uint *)&local_40,(uint *)mesh);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x9b,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aiMesh::~aiMesh(mesh);
  operator_delete(mesh,0x520);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingNeg) {
    aiMesh* p = new aiMesh;
    p->mPrimitiveTypes = aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON;
    ProcessMesh(p);

    // should be unmodified
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);

    delete p;
}